

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
Disa::Adjacency_Graph<false>::capacity(Adjacency_Graph<false> *this)

{
  size_type sVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  unsigned_long local_40;
  ulong local_30;
  unsigned_long local_28;
  Adjacency_Graph<false> *local_20;
  Adjacency_Graph<true> *this_local;
  
  local_20 = this;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::capacity
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18));
  if (sVar1 == 0) {
    local_40 = 0;
  }
  else {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::capacity
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18));
    local_40 = sVar1 - 1;
  }
  local_28 = local_40;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::capacity
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  local_30 = sVar1 >> 1;
  pVar2 = std::make_pair<unsigned_long,unsigned_long>(&local_28,&local_30);
  return pVar2;
}

Assistant:

[[nodiscard]] inline std::pair<std::size_t, std::size_t> capacity() const noexcept {
    return std::make_pair(!offset.capacity() ? 0 : offset.capacity() - 1,
                          !_directed ? vertex_adjacent_list.capacity() / 2 : vertex_adjacent_list.capacity());
  }